

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

bool __thiscall
QGraphicsAnchorLayoutPrivate::simplifyGraph
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  bool bVar1;
  byte bVar2;
  long in_FS_OFFSET;
  bool feasible;
  bool local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->items).d.size == 0) {
    bVar2 = 1;
  }
  else {
    bVar1 = simplifyVertices(this,orientation);
    if (bVar1) {
      local_29 = true;
      do {
        bVar1 = simplifyGraphIteration(this,orientation,&local_29);
        bVar2 = local_29;
        if (!bVar1) break;
      } while ((local_29 & 1U) != 0);
      if ((local_29 & 1U) == 0) {
        restoreSimplifiedGraph(this,orientation);
        restoreVertices(this,orientation);
      }
    }
    else {
      restoreVertices(this,orientation);
      bVar2 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::simplifyGraph(Qt::Orientation orientation)
{
    if (items.isEmpty())
        return true;

#if defined(QT_DEBUG) && 0
    qDebug("Simplifying Graph for %s",
           orientation == Horizontal ? "Horizontal" : "Vertical");

    static int count = 0;
    if (orientation == Horizontal) {
        count++;
        dumpGraph(QString::fromLatin1("%1-full").arg(count));
    }
#endif

    // Vertex simplification
    if (!simplifyVertices(orientation)) {
        restoreVertices(orientation);
        return false;
    }

    // Anchor simplification
    bool dirty;
    bool feasible = true;
    do {
        dirty = simplifyGraphIteration(orientation, &feasible);
    } while (dirty && feasible);

    // Note that if we are not feasible, we fallback and make sure that the graph is fully restored
    if (!feasible) {
        restoreSimplifiedGraph(orientation);
        restoreVertices(orientation);
        return false;
    }

#if defined(QT_DEBUG) && 0
    dumpGraph(QString::fromLatin1("%1-simplified-%2").arg(count).arg(
                  QString::fromLatin1(orientation == Horizontal ? "Horizontal" : "Vertical")));
#endif

    return true;
}